

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<wasm::WATParser::(anonymous_namespace)::LexResult> *
wasm::WATParser::anon_unknown_0::space
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          string_view in)

{
  anon_unknown_0 *paVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 in_RCX [8];
  anon_unknown_0 *paVar7;
  long lVar8;
  anon_unknown_0 *this;
  anon_unknown_0 *paVar9;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view in_00;
  undefined1 local_80 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  anon_unknown_0 *local_60;
  LexCtx local_48;
  
  lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = in._M_str;
  paVar7 = (anon_unknown_0 *)in._M_len;
  paVar9 = (anon_unknown_0 *)0x0;
  do {
    this = paVar7 + -(long)paVar9;
    if (this == (anon_unknown_0 *)0x0) break;
    if (paVar7 < paVar9) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 paVar9,paVar7);
    }
    paVar1 = paVar9 + lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._16_8_;
    in_00._M_str = (char *)in_RCX;
    in_00._M_len = (size_t)paVar1;
    spacechar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_80,this,in_00);
    if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._8_1_ == '\x01') {
      bVar6 = true;
      in_RCX = local_80;
    }
    else {
      local_48.lexedSize = 0;
      local_48.input._M_len = (size_t)this;
      local_48.input._M_str = (char *)paVar1;
      if (this < (anon_unknown_0 *)0x2) {
LAB_00b8fb7d:
        bVar6 = false;
      }
      else {
        sv._M_str = ";;@";
        sv._M_len = 3;
        sVar2 = LexCtx::startsWith(&local_48,sv);
        if (sVar2 != 0) {
LAB_00b8fa43:
          sv_00._M_str = "(;";
          sv_00._M_len = 2;
          sVar2 = LexCtx::startsWith(&local_48,sv_00);
          if (sVar2 != 0) {
            local_48.lexedSize = 2;
            lVar8 = 1;
            do {
              sVar2 = local_48.lexedSize;
              if ((long)this - local_48.lexedSize < 2) {
                bVar6 = false;
                goto LAB_00b8fb7f;
              }
              sv_01._M_str = "(;";
              sv_01._M_len = 2;
              sVar3 = LexCtx::startsWith(&local_48,sv_01);
              if (sVar3 == 0) {
                sv_02._M_str = ";)";
                sv_02._M_len = 2;
                sVar3 = LexCtx::startsWith(&local_48,sv_02);
                if (sVar3 == 0) {
                  local_48.lexedSize = sVar2 + 1;
                }
                else {
                  local_48.lexedSize = sVar2 + 2;
                  lVar8 = lVar8 + -1;
                }
              }
              else {
                local_48.lexedSize = sVar2 + 2;
                lVar8 = lVar8 + 1;
              }
            } while (lVar8 != 0);
            if ((anon_unknown_0 *)local_48.lexedSize != (anon_unknown_0 *)0x0) goto LAB_00b8faed;
          }
          goto LAB_00b8fb7d;
        }
        sv_03._M_str = ";;";
        sv_03._M_len = 2;
        sVar2 = LexCtx::startsWith(&local_48,sv_03);
        if (sVar2 == 0) goto LAB_00b8fa43;
        local_48.lexedSize = 2;
        if (this + -2 == (anon_unknown_0 *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          pvVar4 = memchr(paVar1 + 2,10,(size_t)(this + -2));
          uVar5 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)(paVar1 + 2);
        }
        local_48.lexedSize = (size_t)(uVar5 + 2);
        if (uVar5 == 0xffffffffffffffff) {
          local_48.lexedSize = (size_t)this;
        }
        if ((anon_unknown_0 *)local_48.lexedSize == (anon_unknown_0 *)0x0) goto LAB_00b8fb7d;
LAB_00b8faed:
        local_60 = (anon_unknown_0 *)local_48.lexedSize;
        if (this < local_48.lexedSize) {
          local_60 = this;
        }
        bVar6 = true;
      }
LAB_00b8fb7f:
      in_RCX = (undefined1  [8])0x0;
      if (bVar6) {
        in_RCX = (undefined1  [8])local_60;
      }
    }
    paVar9 = paVar9 + (long)in_RCX;
  } while (bVar6);
  if (paVar9 == (anon_unknown_0 *)0x0) {
    bVar6 = false;
  }
  else {
    if (paVar7 < paVar9) {
      paVar9 = paVar7;
    }
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_payload.
    _M_value.span._M_len = (size_t)paVar9;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_payload.
    _M_value.span._M_str =
         (char *)lexed.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _16_8_;
    bVar6 = true;
  }
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_engaged = bVar6
  ;
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> space(std::string_view in) {
  LexCtx ctx(in);
  while (ctx.size()) {
    if (auto lexed = spacechar(ctx.next())) {
      ctx.take(*lexed);
    } else if (auto lexed = comment(ctx.next())) {
      ctx.take(*lexed);
    } else {
      break;
    }
  }
  return ctx.lexed();
}